

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterOutputNSDecl(xmlTextWriterPtr writer)

{
  int iVar1;
  xmlLinkPtr lk;
  undefined8 *puVar2;
  xmlChar *content;
  xmlChar *name;
  int iVar3;
  
  iVar1 = xmlListEmpty(writer->nsstack);
  iVar3 = 0;
  if (iVar1 == 0) {
    iVar3 = 0;
    do {
      lk = xmlListFront(writer->nsstack);
      puVar2 = (undefined8 *)xmlLinkGetData(lk);
      if (puVar2 == (undefined8 *)0x0) {
        xmlListPopFront(writer->nsstack);
      }
      else {
        content = xmlStrdup((xmlChar *)puVar2[1]);
        name = xmlStrdup((xmlChar *)*puVar2);
        xmlListPopFront(writer->nsstack);
        iVar1 = xmlTextWriterWriteAttribute(writer,name,content);
        (*xmlFree)(content);
        (*xmlFree)(name);
        if (iVar1 < 0) {
          xmlListDelete(writer->nsstack);
          writer->nsstack = (xmlListPtr)0x0;
          return -1;
        }
        iVar3 = iVar3 + iVar1;
      }
      iVar1 = xmlListEmpty(writer->nsstack);
    } while (iVar1 == 0);
  }
  return iVar3;
}

Assistant:

static int
xmlTextWriterOutputNSDecl(xmlTextWriterPtr writer)
{
    xmlLinkPtr lk;
    xmlTextWriterNsStackEntry *np;
    int count;
    int sum;

    sum = 0;
    while (!xmlListEmpty(writer->nsstack)) {
        xmlChar *namespaceURI = NULL;
        xmlChar *prefix = NULL;

        lk = xmlListFront(writer->nsstack);
        np = (xmlTextWriterNsStackEntry *) xmlLinkGetData(lk);

        if (np != 0) {
            namespaceURI = xmlStrdup(np->uri);
            prefix = xmlStrdup(np->prefix);
        }

        xmlListPopFront(writer->nsstack);

        if (np != 0) {
            count = xmlTextWriterWriteAttribute(writer, prefix, namespaceURI);
            xmlFree(namespaceURI);
            xmlFree(prefix);

            if (count < 0) {
                xmlListDelete(writer->nsstack);
                writer->nsstack = NULL;
                return -1;
            }
            sum += count;
        }
    }
    return sum;
}